

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O3

void __thiscall wasm::Flatten::visitFunction(Flatten *this,Function *curr)

{
  Expression *after;
  Expression *pEVar1;
  
  pEVar1 = curr->body;
  after = pEVar1;
  if (1 < (pEVar1->type).id) {
    after = (Expression *)
            MixedArena::allocSpace
                      (&((this->
                         super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                         ).
                         super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                         .
                         super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                         .
                         super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        .currModule)->allocator,0x18,8);
    after->_id = ReturnId;
    (after->type).id = 1;
    *(Expression **)(after + 1) = pEVar1;
    curr->body = after;
  }
  pEVar1 = getPreludesWithExpression(this,pEVar1,after);
  curr->body = pEVar1;
  EHUtils::handleBlockNestedPops
            (curr,(this->
                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                  ).
                  super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                  .
                  super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                  .super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                  .currModule,SkipIfNoEH);
  return;
}

Assistant:

void visitFunction(Function* curr) {
    auto* originalBody = curr->body;
    // if the body is a block with a result, turn that into a return
    if (curr->body->type.isConcrete()) {
      curr->body = Builder(*getModule()).makeReturn(curr->body);
    }
    // the body may have preludes
    curr->body = getPreludesWithExpression(originalBody, curr->body);

    // Flatten can generate blocks within 'catch', making pops invalid. Fix them
    // up.
    EHUtils::handleBlockNestedPops(curr, *getModule());
  }